

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  DefaultDisableDeclarationSyntax *pDVar1;
  Token *unaff_retaddr;
  Token *in_stack_00000008;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000010;
  BumpAllocator *in_stack_00000018;
  Token *in_stack_00000030;
  BumpAllocator *in_stack_00000038;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000040;
  BumpAllocator *in_stack_000000d8;
  Token *in_stack_000000e0;
  BumpAllocator *in_stack_ffffffffffffff88;
  ExpressionSyntax *in_stack_ffffffffffffff90;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000040,in_stack_00000038);
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa318f8);
  deepClone<slang::syntax::ExpressionSyntax>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DefaultDisableDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token>
                     (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                      (Token *)__fn,(ExpressionSyntax *)__child_stack,in_stack_00000030);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DefaultDisableDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DefaultDisableDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.defaultKeyword.deepClone(alloc),
        node.disableKeyword.deepClone(alloc),
        node.iffKeyword.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.semi.deepClone(alloc)
    );
}